

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

void __thiscall mocker::ir::Builder::operator()(Builder *this,IfStmt *node)

{
  FunctionModule *this_00;
  _List_node_base *p_Var1;
  element_type *peVar2;
  BuilderContext *pBVar3;
  element_type *peVar4;
  bool bVar5;
  BBLIter BVar6;
  BBLIter BVar7;
  BBLIter bblIter;
  shared_ptr<mocker::ir::Jump> jump;
  shared_ptr<mocker::ir::Label> successorLabel;
  undefined1 local_99;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  Jump *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _List_node_base *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  shared_ptr<mocker::ir::IRInst> local_70;
  shared_ptr<mocker::ir::IRInst> local_60;
  _List_node_base *local_50;
  BBLIter local_48;
  shared_ptr<mocker::ir::Label> local_40;
  
  local_48 = BuilderContext::getCurBasicBlock(this->ctx);
  this_00 = this->ctx->curFunc;
  BVar6 = FunctionModule::insertBBAfter(this_00,local_48);
  p_Var1 = BVar6._M_node[1]._M_next;
  local_78 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_78->_M_use_count = 1;
  local_78->_M_weak_count = 1;
  local_78->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
  local_78[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
  *(_List_node_base **)&local_78[1]._M_use_count = p_Var1;
  local_50 = BVar6._M_node;
  BuilderContext::setCurBasicBlock(this->ctx,BVar6);
  peVar2 = (node->then).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
            (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  BVar6 = BuilderContext::getCurBasicBlock(this->ctx);
  if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    bblIter._M_node = (_List_node_base *)0x0;
    local_80 = (_List_node_base *)0x0;
    BVar7 = BVar6;
  }
  else {
    BVar7 = FunctionModule::insertBBAfter(this_00,BVar6);
    p_Var1 = BVar7._M_node[1]._M_next;
    local_98 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_98->_M_use_count = 1;
    local_98->_M_weak_count = 1;
    local_98->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
    local_98[1]._vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
    *(_List_node_base **)&local_98[1]._M_use_count = p_Var1;
    local_80 = BVar7._M_node;
    BuilderContext::setCurBasicBlock(this->ctx,BVar7);
    peVar2 = (node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (*(peVar2->super_ASTNode)._vptr_ASTNode[3])
              (peVar2,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
    bblIter = BuilderContext::getCurBasicBlock(this->ctx);
    BVar7 = bblIter;
    if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      BVar7 = BVar6;
    }
  }
  BVar7 = FunctionModule::insertBBAfter(this_00,BVar7);
  p_Var1 = BVar7._M_node[1]._M_next;
  local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_use_count = 1;
  (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _M_weak_count = 1;
  (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e8af0;
  local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       + 1);
  local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)&PTR__Addr_001e8b68;
  *(_List_node_base **)
   &local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
    _M_use_count = p_Var1;
  local_90 = (Jump *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<mocker::ir::Jump,std::allocator<mocker::ir::Jump>,std::shared_ptr<mocker::ir::Label>&>
            (&local_88,&local_90,(allocator<mocker::ir::Jump> *)&local_99,&local_40);
  bVar5 = BasicBlock::isCompleted((BasicBlock *)(BVar6._M_node + 1));
  if (!bVar5) {
    pBVar3 = this->ctx;
    local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_90->super_IRInst;
    local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_88._M_pi;
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      }
    }
    BuilderContext::appendInst(pBVar3,BVar6,&local_60);
    if (local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_60.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  if (((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       != (element_type *)0x0) &&
     (bVar5 = BasicBlock::isCompleted((BasicBlock *)(bblIter._M_node + 1)), !bVar5)) {
    pBVar3 = this->ctx;
    local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_90->super_IRInst;
    local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         local_88._M_pi;
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      }
    }
    BuilderContext::appendInst(pBVar3,bblIter,&local_70);
    if (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  pBVar3 = this->ctx;
  (pBVar3->logicalExprInfo).inCondition = true;
  (pBVar3->logicalExprInfo).trueNext._M_node = local_50;
  BVar6._M_node = local_80;
  if ((node->else_).super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    BVar6 = BVar7;
  }
  (pBVar3->logicalExprInfo).falseNext._M_node = BVar6._M_node;
  (pBVar3->logicalExprInfo).empty = false;
  BuilderContext::setCurBasicBlock(this->ctx,local_48);
  peVar4 = (node->condition).super___shared_ptr<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  (*(peVar4->super_ASTNode)._vptr_ASTNode[3])
            (peVar4,&this->field_0x0 + *(long *)(*(long *)this + -0xf0));
  (pBVar3->logicalExprInfo).empty = true;
  (pBVar3->logicalExprInfo).inCondition = false;
  BuilderContext::setCurBasicBlock(this->ctx,BVar7);
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  if (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  return;
}

Assistant:

void Builder::operator()(const ast::IfStmt &node) const {
  auto originalBB = ctx.getCurBasicBlock();
  FunctionModule &func = ctx.getCurFunc();

  auto thenFirstBB = func.insertBBAfter(originalBB);
  auto thenFirstLabel = getBBLabel(thenFirstBB);
  ctx.setCurBasicBlock(thenFirstBB);
  visit(*node.then);
  auto thenLastBB = ctx.getCurBasicBlock();

  BBLIter elseFirstBB, elseLastBB;
  std::shared_ptr<Label> elseFirstLabel = nullptr;
  if (node.else_) {
    elseFirstBB = func.insertBBAfter(thenLastBB);
    elseFirstLabel = getBBLabel(elseFirstBB);
    ctx.setCurBasicBlock(elseFirstBB);
    visit(*node.else_);
    elseLastBB = ctx.getCurBasicBlock();
  }

  auto successorBB = func.insertBBAfter(node.else_ ? elseLastBB : thenLastBB);
  auto successorLabel = std::make_shared<Label>(successorBB->getLabelID());
  auto jump = std::make_shared<Jump>(successorLabel);
  if (!thenLastBB->isCompleted())
    ctx.appendInst(thenLastBB, jump);
  if (node.else_ && !elseLastBB->isCompleted())
    ctx.appendInst(elseLastBB, jump);

  auto &info = ctx.getLogicalExprInfo();
  info.inCondition = true;
  info.trueNext = thenFirstBB;
  info.falseNext = node.else_ ? elseFirstBB : successorBB;
  info.empty = false;
  ctx.setCurBasicBlock(originalBB);
  visit(*node.condition);
  info.empty = true;
  info.inCondition = false;

  ctx.setCurBasicBlock(successorBB);
}